

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

bool google::protobuf::compiler::objectivec::IsPrimitiveType(FieldDescriptor *field)

{
  ObjectiveCType OVar1;
  
  OVar1 = GetObjectiveCType(field);
  return (bool)((byte)(0x27f >> ((byte)OVar1 & 0x1f)) & OVar1 < OBJECTIVECTYPE_MESSAGE);
}

Assistant:

bool IsPrimitiveType(const FieldDescriptor* field) {
  ObjectiveCType type = GetObjectiveCType(field);
  switch (type) {
    case OBJECTIVECTYPE_INT32:
    case OBJECTIVECTYPE_UINT32:
    case OBJECTIVECTYPE_INT64:
    case OBJECTIVECTYPE_UINT64:
    case OBJECTIVECTYPE_FLOAT:
    case OBJECTIVECTYPE_DOUBLE:
    case OBJECTIVECTYPE_BOOLEAN:
    case OBJECTIVECTYPE_ENUM:
      return true;
      break;
    default:
      return false;
  }
}